

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O2

void ncnn::transpose_pack_B_tile_int8(Mat *B,Mat *BT,int batch,int max_jj,int max_kk,int nT)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  undefined1 (*pauVar24) [16];
  undefined2 *puVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [64];
  ulong uVar39;
  long lVar40;
  void *pvVar41;
  long lVar42;
  long lVar43;
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  long local_120;
  long local_110;
  ulong local_108;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  
  lVar36 = (long)max_jj;
  iVar19 = max_jj * batch;
  lVar40 = (long)iVar19;
  lVar20 = (long)(iVar19 * 0x10);
  lVar33 = (long)(iVar19 * 8);
  uVar31 = 0;
  uVar21 = (ulong)(uint)batch;
  if (batch < 1) {
    uVar21 = uVar31;
  }
  lVar26 = (long)(iVar19 * 2);
  lVar14 = lVar20 * 2;
  lVar18 = lVar36 * 0x20;
  lVar1 = lVar36 * 4;
  lVar15 = lVar33 * 2;
  lVar17 = lVar36 * 2;
  lVar16 = lVar26 * 2;
  lVar32 = 0x1c0;
  auVar44 = vpmovsxbd_avx512f(_DAT_005396f0);
  auVar45 = vpmovsxbd_avx512f(_DAT_00539700);
  lVar34 = 0xc0;
  lVar42 = 0x40;
  local_98 = 0x20;
  lVar22 = 2;
  local_a8 = 2;
  local_a0 = 6;
  local_b0 = 6;
  local_b8 = 0;
  local_c0 = 0;
  local_e0 = 0;
  for (uVar39 = 0; uVar39 != uVar21; uVar39 = uVar39 + 1) {
    pauVar38 = (undefined1 (*) [64])((long)BT->w * uVar39 * BT->elemsize + (long)BT->data);
    local_120 = local_a8;
    local_d8 = local_a0;
    local_f8 = local_98;
    local_e8 = local_b0;
    local_110 = local_c0;
    lVar23 = lVar32;
    lVar27 = local_b8;
    lVar30 = lVar42;
    lVar35 = lVar34;
    lVar43 = local_e0;
    local_108 = uVar31;
    local_f0 = lVar22;
    for (uVar29 = 0; (long)(uVar29 | 0xf) < lVar36; uVar29 = uVar29 + 0x10) {
      pvVar7 = B->data;
      pauVar37 = (undefined1 (*) [32])((long)pvVar7 + lVar27);
      lVar28 = 0;
      pvVar41 = pvVar7;
      for (iVar19 = 0; iVar19 + 0xf < max_kk; iVar19 = iVar19 + 0x10) {
        auVar46 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar23 + -0x1c0));
        auVar47 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar23 + -0x180));
        auVar48 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar23 + -0xc0));
        auVar49 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar23 + -0x80));
        auVar50 = vinserti64x4_avx512f
                            (auVar46,*(undefined1 (*) [32])((long)pvVar41 + lVar23 + -0xa0),1);
        auVar46 = vshufi64x2_avx512f(auVar46,*(undefined1 (*) [64])((long)pvVar41 + lVar23 + -0x140)
                                     ,0xee);
        auVar51 = vinserti64x4_avx512f
                            (auVar47,*(undefined1 (*) [32])((long)pvVar41 + lVar23 + -0x80),1);
        auVar47 = vshufi64x2_avx512f(auVar47,*(undefined1 (*) [64])((long)pvVar41 + lVar23 + -0x100)
                                     ,0xee);
        auVar52 = vinserti64x4_avx512f
                            (auVar48,*(undefined1 (*) [32])((long)pvVar41 + lVar23 + -0x20),1);
        auVar48 = vshufi64x2_avx512f(auVar48,*(undefined1 (*) [64])((long)pvVar41 + lVar23 + -0x40),
                                     0xee);
        auVar53 = vinserti64x4_avx512f(auVar49,*(undefined1 (*) [32])((long)pvVar41 + lVar23),1);
        auVar49 = vshufi64x2_avx512f(auVar49,*(undefined1 (*) [64])((long)pvVar41 + lVar23),0xee);
        auVar54 = vpunpckldq_avx512f(auVar50,auVar46);
        auVar46 = vpunpckhdq_avx512f(auVar50,auVar46);
        auVar50 = vpunpckldq_avx512f(auVar51,auVar47);
        auVar47 = vpunpckhdq_avx512f(auVar51,auVar47);
        auVar51 = vpunpckldq_avx512f(auVar52,auVar48);
        auVar48 = vpunpckhdq_avx512f(auVar52,auVar48);
        auVar52 = vpunpckldq_avx512f(auVar53,auVar49);
        auVar49 = vpunpckhdq_avx512f(auVar53,auVar49);
        auVar53 = vpunpcklqdq_avx512f(auVar54,auVar50);
        auVar50 = vpunpckhqdq_avx512f(auVar54,auVar50);
        auVar54 = vpunpcklqdq_avx512f(auVar46,auVar47);
        auVar46 = vpunpckhqdq_avx512f(auVar46,auVar47);
        auVar47 = vpunpcklqdq_avx512f(auVar51,auVar52);
        auVar51 = vpunpckhqdq_avx512f(auVar51,auVar52);
        auVar52 = vpunpcklqdq_avx512f(auVar48,auVar49);
        auVar48 = vpunpckhqdq_avx512f(auVar48,auVar49);
        auVar49 = vshufi64x2_avx512f(auVar53,auVar47,0x88);
        auVar55 = vshufi64x2_avx512f(auVar50,auVar51,0x88);
        auVar56 = vshufi64x2_avx512f(auVar54,auVar52,0x88);
        auVar57 = vshufi64x2_avx512f(auVar46,auVar48,0x88);
        auVar47 = vshufi64x2_avx512f(auVar53,auVar47,0xdd);
        auVar50 = vshufi64x2_avx512f(auVar50,auVar51,0xdd);
        auVar51 = vshufi64x2_avx512f(auVar54,auVar52,0xdd);
        auVar48 = vshufi64x2_avx512f(auVar46,auVar48,0xdd);
        auVar46 = vmovdqu64_avx512f(auVar49);
        *pauVar38 = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar55);
        pauVar38[1] = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar56);
        pauVar38[2] = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar57);
        pauVar38[3] = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar47);
        pauVar38[4] = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar50);
        pauVar38[5] = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar51);
        pauVar38[6] = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar48);
        pauVar38[7] = auVar46;
        pauVar38 = pauVar38 + 8;
        pvVar41 = (void *)((long)pvVar41 + lVar14);
        lVar28 = lVar28 + lVar14;
        pauVar37 = (undefined1 (*) [32])(*pauVar37 + lVar14);
      }
      for (; iVar19 + 7 < max_kk; iVar19 = iVar19 + 8) {
        auVar46 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar43));
        auVar47 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar43 + 0x40));
        auVar48 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar43 + 0x80));
        auVar49 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar43 + 0xc0));
        auVar50 = vshufi64x2_avx512f(auVar46,auVar47,0x88);
        auVar46 = vshufi64x2_avx512f(auVar46,auVar47,0xdd);
        auVar47 = vshufi64x2_avx512f(auVar48,auVar49,0x88);
        auVar48 = vshufi64x2_avx512f(auVar48,auVar49,0xdd);
        auVar49 = vmovdqa64_avx512f(auVar50);
        auVar49 = vpermt2d_avx512f(auVar49,auVar44,auVar46);
        auVar51 = vmovdqa64_avx512f(auVar47);
        auVar51 = vpermt2d_avx512f(auVar51,auVar44,auVar48);
        auVar52 = vshufi64x2_avx512f(auVar49,auVar51,0x88);
        auVar49 = vshufi64x2_avx512f(auVar49,auVar51,0xdd);
        auVar46 = vpermt2d_avx512f(auVar50,auVar45,auVar46);
        auVar47 = vpermt2d_avx512f(auVar47,auVar45,auVar48);
        auVar48 = vshufi64x2_avx512f(auVar46,auVar47,0x88);
        auVar47 = vshufi64x2_avx512f(auVar46,auVar47,0xdd);
        auVar46 = vmovdqu64_avx512f(auVar52);
        *pauVar38 = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar49);
        pauVar38[1] = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar48);
        pauVar38[2] = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar47);
        pauVar38[3] = auVar46;
        pauVar38 = pauVar38 + 4;
        pvVar41 = (void *)((long)pvVar41 + lVar15);
        lVar28 = lVar28 + lVar15;
        pauVar37 = (undefined1 (*) [32])(*pauVar37 + lVar15);
      }
      for (; iVar19 + 1 < max_kk; iVar19 = iVar19 + 2) {
        auVar46 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar7 + lVar28 + local_110));
        auVar46 = vmovdqu64_avx512f(auVar46);
        *pauVar38 = auVar46;
        pauVar38 = pauVar38 + 1;
        lVar28 = lVar28 + lVar16;
        pauVar37 = (undefined1 (*) [32])(*pauVar37 + lVar16);
      }
      for (; iVar19 < max_kk; iVar19 = iVar19 + 1) {
        *(undefined1 (*) [32])*pauVar38 = *pauVar37;
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x20);
        pauVar37 = (undefined1 (*) [32])(*pauVar37 + lVar40 * 2);
      }
      lVar43 = lVar43 + 0x100;
      lVar23 = lVar23 + 0x200;
      local_110 = local_110 + 0x40;
      lVar27 = lVar27 + 0x20;
      lVar35 = lVar35 + 0x200;
      lVar30 = lVar30 + 0x200;
      local_e8 = local_e8 + 0x20;
      local_f8 = local_f8 + 0x200;
      local_d8 = local_d8 + 0x40;
      local_120 = local_120 + 0x20;
      local_108 = local_108 + 0x200;
      local_f0 = local_f0 + 0x40;
    }
    for (; (long)(uVar29 | 7) < lVar36; uVar29 = uVar29 + 8) {
      pvVar7 = B->data;
      pauVar24 = (undefined1 (*) [16])((long)pvVar7 + lVar27);
      lVar23 = 0;
      pvVar41 = pvVar7;
      for (iVar19 = 0; iVar19 + 0xf < max_kk; iVar19 = iVar19 + 0x10) {
        auVar46 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar35 + -0xc0));
        auVar47 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar35 + -0x80));
        auVar48 = vinserti64x4_avx512f
                            (auVar46,*(undefined1 (*) [32])((long)pvVar41 + lVar35 + -0x20),1);
        auVar46 = vshufi64x2_avx512f(auVar46,*(undefined1 (*) [64])((long)pvVar41 + lVar35 + -0x40),
                                     0xee);
        auVar49 = vinserti64x4_avx512f(auVar47,*(undefined1 (*) [32])((long)pvVar41 + lVar35),1);
        auVar47 = vshufi64x2_avx512f(auVar47,*(undefined1 (*) [64])((long)pvVar41 + lVar35),0xee);
        auVar50 = vpunpckldq_avx512f(auVar48,auVar46);
        auVar46 = vpunpckhdq_avx512f(auVar48,auVar46);
        auVar48 = vpunpckldq_avx512f(auVar49,auVar47);
        auVar47 = vpunpckhdq_avx512f(auVar49,auVar47);
        auVar49 = vpunpcklqdq_avx512f(auVar50,auVar48);
        auVar48 = vpunpckhqdq_avx512f(auVar50,auVar48);
        auVar50 = vpunpcklqdq_avx512f(auVar46,auVar47);
        auVar46 = vpunpckhqdq_avx512f(auVar46,auVar47);
        auVar47 = vshufi64x2_avx512f(auVar49,auVar48,0x88);
        auVar51 = vshufi64x2_avx512f(auVar50,auVar46,0x88);
        auVar48 = vshufi64x2_avx512f(auVar49,auVar48,0xdd);
        auVar49 = vshufi64x2_avx512f(auVar50,auVar46,0xdd);
        auVar46 = vmovdqu64_avx512f(auVar47);
        *pauVar38 = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar51);
        pauVar38[1] = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar48);
        pauVar38[2] = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar49);
        pauVar38[3] = auVar46;
        pauVar38 = pauVar38 + 4;
        pvVar41 = (void *)((long)pvVar41 + lVar14);
        lVar23 = lVar23 + lVar14;
        pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar14);
      }
      for (; iVar19 + 7 < max_kk; iVar19 = iVar19 + 8) {
        auVar5 = *(undefined1 (*) [32])((long)pvVar41 + lVar43 + 0x20);
        auVar6 = *(undefined1 (*) [32])((long)pvVar41 + lVar43 + 0x40);
        auVar58 = *(undefined1 (*) [32])((long)pvVar41 + lVar43 + 0x60);
        auVar12 = vperm2f128_avx(*(undefined1 (*) [32])((long)pvVar41 + lVar43),auVar6,0x20);
        auVar6 = vperm2f128_avx(*(undefined1 (*) [32])((long)pvVar41 + lVar43),auVar6,0x31);
        auVar13 = vperm2f128_avx(auVar5,auVar58,0x20);
        auVar58 = vperm2f128_avx(auVar5,auVar58,0x31);
        auVar5 = vunpcklps_avx(auVar12,auVar6);
        auVar6 = vunpckhps_avx(auVar12,auVar6);
        auVar11 = vunpcklps_avx(auVar13,auVar58);
        auVar58 = vunpckhps_avx(auVar13,auVar58);
        auVar12 = vunpcklpd_avx(auVar5,auVar11);
        auVar5 = vunpckhpd_avx(auVar5,auVar11);
        auVar11 = vunpcklpd_avx(auVar6,auVar58);
        auVar6 = vunpckhpd_avx(auVar6,auVar58);
        *(undefined1 (*) [32])*pauVar38 = auVar12;
        *(undefined1 (*) [32])(*pauVar38 + 0x20) = auVar5;
        *(undefined1 (*) [32])pauVar38[1] = auVar11;
        *(undefined1 (*) [32])(pauVar38[1] + 0x20) = auVar6;
        pauVar38 = pauVar38 + 2;
        pvVar41 = (void *)((long)pvVar41 + lVar15);
        lVar23 = lVar23 + lVar15;
        pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar15);
      }
      for (; iVar19 + 1 < max_kk; iVar19 = iVar19 + 2) {
        *(undefined1 (*) [32])*pauVar38 = *(undefined1 (*) [32])((long)pvVar7 + lVar23 + local_110);
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x20);
        lVar23 = lVar23 + lVar16;
        pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar16);
      }
      for (; iVar19 < max_kk; iVar19 = iVar19 + 1) {
        *(undefined1 (*) [16])*pauVar38 = *pauVar24;
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x10);
        pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar40 * 2);
      }
      lVar43 = lVar43 + 0x80;
      lVar35 = lVar35 + 0x100;
      local_110 = local_110 + 0x20;
      lVar27 = lVar27 + 0x10;
      lVar30 = lVar30 + 0x100;
      local_e8 = local_e8 + 0x10;
      local_f8 = local_f8 + 0x100;
      local_d8 = local_d8 + 0x20;
      local_120 = local_120 + 0x10;
      local_108 = local_108 + 0x100;
      local_f0 = local_f0 + 0x20;
    }
    for (; (long)(uVar29 | 3) < lVar36; uVar29 = uVar29 + 4) {
      pvVar7 = B->data;
      puVar25 = (undefined2 *)((long)pvVar7 + local_e8);
      lVar23 = 0;
      pvVar41 = pvVar7;
      for (iVar19 = 0; iVar19 + 0xf < max_kk; iVar19 = iVar19 + 0x10) {
        auVar46 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar41 + lVar30 + -0x40));
        auVar47 = vinserti64x4_avx512f(auVar46,*(undefined1 (*) [32])((long)pvVar41 + lVar30),1);
        auVar46 = vshufi64x2_avx512f(auVar46,*(undefined1 (*) [64])((long)pvVar41 + lVar30),0xee);
        auVar48 = vmovdqa64_avx512f(auVar47);
        auVar48 = vpermt2d_avx512f(auVar48,auVar44,auVar46);
        auVar46 = vpermt2d_avx512f(auVar47,auVar45,auVar46);
        auVar47 = vinserti64x4_avx512f(auVar48,auVar46._0_32_,1);
        auVar46 = vshufi64x2_avx512f(auVar48,auVar46,0xee);
        auVar48 = vpunpcklqdq_avx512f(auVar47,auVar46);
        auVar47 = vpunpckhqdq_avx512f(auVar47,auVar46);
        auVar46 = vmovdqu64_avx512f(auVar48);
        *pauVar38 = auVar46;
        auVar46 = vmovdqu64_avx512f(auVar47);
        pauVar38[1] = auVar46;
        pauVar38 = pauVar38 + 2;
        pvVar41 = (void *)((long)pvVar41 + lVar14);
        lVar23 = lVar23 + lVar14;
        puVar25 = puVar25 + lVar20;
      }
      for (; iVar19 + 7 < max_kk; iVar19 = iVar19 + 8) {
        auVar2 = *(undefined1 (*) [16])((long)pvVar41 + lVar43 + 0x10);
        auVar3 = *(undefined1 (*) [16])((long)pvVar41 + lVar43 + 0x20);
        auVar4 = *(undefined1 (*) [16])((long)pvVar41 + lVar43 + 0x30);
        auVar8 = vpunpckldq_avx(*(undefined1 (*) [16])((long)pvVar41 + lVar43),auVar2);
        auVar2 = vpunpckhdq_avx(*(undefined1 (*) [16])((long)pvVar41 + lVar43),auVar2);
        auVar9 = vpunpckldq_avx(auVar3,auVar4);
        auVar3 = vpunpckhdq_avx(auVar3,auVar4);
        auVar10 = vpunpcklqdq_avx(auVar8,auVar9);
        auVar4 = vpunpckhqdq_avx(auVar8,auVar9);
        auVar8 = vpunpcklqdq_avx(auVar2,auVar3);
        auVar2 = vpunpckhqdq_avx(auVar2,auVar3);
        *(undefined1 (*) [16])*pauVar38 = auVar10;
        *(undefined1 (*) [16])(*pauVar38 + 0x10) = auVar4;
        *(undefined1 (*) [16])(*pauVar38 + 0x20) = auVar8;
        *(undefined1 (*) [16])(*pauVar38 + 0x30) = auVar2;
        pauVar38 = pauVar38 + 1;
        pvVar41 = (void *)((long)pvVar41 + lVar15);
        lVar23 = lVar23 + lVar15;
        puVar25 = puVar25 + lVar33;
      }
      for (; iVar19 + 1 < max_kk; iVar19 = iVar19 + 2) {
        *(undefined1 (*) [16])*pauVar38 = *(undefined1 (*) [16])((long)pvVar7 + lVar23 + local_110);
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x10);
        lVar23 = lVar23 + lVar16;
        puVar25 = puVar25 + lVar26;
      }
      for (; iVar19 < max_kk; iVar19 = iVar19 + 1) {
        *(undefined2 *)*pauVar38 = puVar25[-3];
        *(undefined2 *)(*pauVar38 + 2) = puVar25[-2];
        *(undefined2 *)(*pauVar38 + 4) = puVar25[-1];
        *(undefined2 *)(*pauVar38 + 6) = *puVar25;
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 8);
        puVar25 = puVar25 + lVar40;
      }
      lVar43 = lVar43 + 0x40;
      lVar30 = lVar30 + 0x80;
      local_110 = local_110 + 0x10;
      local_e8 = local_e8 + 8;
      local_f8 = local_f8 + 0x80;
      lVar27 = lVar27 + 8;
      local_d8 = local_d8 + 0x10;
      local_120 = local_120 + 8;
      local_108 = local_108 + 0x80;
      local_f0 = local_f0 + 0x10;
    }
    for (; (long)(uVar29 | 1) < lVar36; uVar29 = uVar29 + 2) {
      pvVar7 = B->data;
      puVar25 = (undefined2 *)(local_120 + (long)pvVar7);
      lVar23 = 0;
      pvVar41 = pvVar7;
      for (iVar19 = 0; iVar19 + 0xf < max_kk; iVar19 = iVar19 + 0x10) {
        auVar5 = *(undefined1 (*) [32])((long)pvVar41 + local_f8 + -0x20);
        auVar6 = vpunpckldq_avx2(auVar5,*(undefined1 (*) [32])((long)pvVar41 + local_f8));
        auVar5 = vpunpckhdq_avx2(auVar5,*(undefined1 (*) [32])((long)pvVar41 + local_f8));
        auVar58._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar6._0_16_;
        auVar58._16_16_ = ZEXT116(0) * auVar6._16_16_ + ZEXT116(1) * auVar5._0_16_;
        auVar5 = vperm2i128_avx2(auVar6,auVar5,0x31);
        *(undefined1 (*) [32])*pauVar38 = auVar58;
        *(undefined1 (*) [32])(*pauVar38 + 0x20) = auVar5;
        pauVar38 = pauVar38 + 1;
        pvVar41 = (void *)((long)pvVar41 + lVar14);
        lVar23 = lVar23 + lVar14;
        puVar25 = puVar25 + lVar20;
      }
      for (; iVar19 + 7 < max_kk; iVar19 = iVar19 + 8) {
        auVar2 = *(undefined1 (*) [16])((long)pvVar41 + lVar43 + 0x10);
        auVar3 = vpunpckldq_avx(*(undefined1 (*) [16])((long)pvVar41 + lVar43),auVar2);
        auVar2 = vpunpckhdq_avx(*(undefined1 (*) [16])((long)pvVar41 + lVar43),auVar2);
        *(undefined1 (*) [16])*pauVar38 = auVar3;
        *(undefined1 (*) [16])(*pauVar38 + 0x10) = auVar2;
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x20);
        pvVar41 = (void *)((long)pvVar41 + lVar15);
        lVar23 = lVar23 + lVar15;
        puVar25 = puVar25 + lVar33;
      }
      for (; iVar19 + 1 < max_kk; iVar19 = iVar19 + 2) {
        *(undefined2 *)*pauVar38 = *(undefined2 *)((long)pvVar7 + lVar23 + local_d8 + -6);
        *(undefined2 *)(*pauVar38 + 2) = *(undefined2 *)((long)pvVar7 + lVar23 + local_d8 + -4);
        *(undefined2 *)(*pauVar38 + 4) = *(undefined2 *)((long)pvVar7 + lVar23 + local_d8 + -2);
        *(undefined2 *)(*pauVar38 + 6) = *(undefined2 *)((long)pvVar7 + lVar23 + local_d8);
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 8);
        lVar23 = lVar23 + lVar16;
        puVar25 = puVar25 + lVar26;
      }
      for (; iVar19 < max_kk; iVar19 = iVar19 + 1) {
        *(undefined2 *)*pauVar38 = puVar25[-1];
        *(undefined2 *)(*pauVar38 + 2) = *puVar25;
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 4);
        puVar25 = puVar25 + lVar40;
      }
      lVar43 = lVar43 + 0x20;
      local_f8 = local_f8 + 0x40;
      local_d8 = local_d8 + 8;
      local_120 = local_120 + 4;
      local_108 = local_108 + 0x40;
      lVar27 = lVar27 + 4;
      local_f0 = local_f0 + 8;
    }
    for (; (long)uVar29 < lVar36; uVar29 = uVar29 + 1) {
      pvVar7 = B->data;
      puVar25 = (undefined2 *)((long)pvVar7 + lVar27);
      lVar23 = 0;
      pvVar41 = pvVar7;
      for (iVar19 = 0; iVar19 + 0xf < max_kk; iVar19 = iVar19 + 0x10) {
        *(undefined1 (*) [32])*pauVar38 = *(undefined1 (*) [32])((long)pvVar41 + local_108);
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x20);
        pvVar41 = (void *)((long)pvVar41 + lVar14);
        lVar23 = lVar23 + lVar14;
        puVar25 = puVar25 + lVar20;
      }
      for (; iVar19 + 7 < max_kk; iVar19 = iVar19 + 8) {
        *(undefined1 (*) [16])*pauVar38 = *(undefined1 (*) [16])((long)pvVar41 + lVar43);
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x10);
        pvVar41 = (void *)((long)pvVar41 + lVar15);
        lVar23 = lVar23 + lVar15;
        puVar25 = puVar25 + lVar33;
      }
      for (; iVar19 + 1 < max_kk; iVar19 = iVar19 + 2) {
        *(undefined2 *)*pauVar38 = *(undefined2 *)((long)pvVar7 + lVar23 + local_f0 + -2);
        *(undefined2 *)(*pauVar38 + 2) = *(undefined2 *)((long)pvVar7 + lVar23 + local_f0);
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 4);
        lVar23 = lVar23 + lVar16;
        puVar25 = puVar25 + lVar26;
      }
      for (; iVar19 < max_kk; iVar19 = iVar19 + 1) {
        *(undefined2 *)*pauVar38 = *puVar25;
        pauVar38 = (undefined1 (*) [64])(*pauVar38 + 2);
        puVar25 = puVar25 + lVar40;
      }
      lVar43 = lVar43 + 0x10;
      local_108 = local_108 + 0x20;
      lVar27 = lVar27 + 2;
      local_f0 = local_f0 + 4;
    }
    local_e0 = local_e0 + lVar36 * 0x10;
    lVar32 = lVar32 + lVar18;
    local_c0 = local_c0 + lVar1;
    local_b8 = local_b8 + lVar17;
    lVar34 = lVar34 + lVar18;
    lVar42 = lVar42 + lVar18;
    local_b0 = local_b0 + lVar17;
    local_98 = local_98 + lVar18;
    local_a0 = local_a0 + lVar1;
    local_a8 = local_a8 + lVar17;
    uVar31 = uVar31 + lVar18;
    lVar22 = lVar22 + lVar1;
  }
  return;
}

Assistant:

static void transpose_pack_B_tile_int8(const Mat& B, Mat& BT, int batch, int max_jj, int max_kk, int nT)
{
    #pragma omp parallel for num_threads(nT)
    for (int b = 0; b < batch; b++)
    {
        short* pp = BT.row<short>(b);

        int jj = 0;
#if __SSE2__
#if defined(__x86_64__) || defined(_M_X64)
#if __AVX512F__
        for (; jj + 15 < max_jj; jj += 16)
        {
            const short* p0 = B;

            int kk = 0;
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _r4 = _mm512_loadu_si512((const __m512i*)(p0 + 128));
                __m512i _r5 = _mm512_loadu_si512((const __m512i*)(p0 + 160));
                __m512i _r6 = _mm512_loadu_si512((const __m512i*)(p0 + 192));
                __m512i _r7 = _mm512_loadu_si512((const __m512i*)(p0 + 224));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp4 = _mm512_shuffle_i32x4(_r4, _r6, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp5 = _mm512_shuffle_i32x4(_r4, _r6, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp6 = _mm512_shuffle_i32x4(_r5, _r7, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp7 = _mm512_shuffle_i32x4(_r5, _r7, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _r4 = _mm512_unpacklo_epi32(_tmp4, _tmp5);
                _r5 = _mm512_unpackhi_epi32(_tmp4, _tmp5);
                _r6 = _mm512_unpacklo_epi32(_tmp6, _tmp7);
                _r7 = _mm512_unpackhi_epi32(_tmp6, _tmp7);
                _tmp0 = _mm512_unpacklo_epi64(_r0, _r2);
                _tmp1 = _mm512_unpackhi_epi64(_r0, _r2);
                _tmp2 = _mm512_unpacklo_epi64(_r1, _r3);
                _tmp3 = _mm512_unpackhi_epi64(_r1, _r3);
                _tmp4 = _mm512_unpacklo_epi64(_r4, _r6);
                _tmp5 = _mm512_unpackhi_epi64(_r4, _r6);
                _tmp6 = _mm512_unpacklo_epi64(_r5, _r7);
                _tmp7 = _mm512_unpackhi_epi64(_r5, _r7);
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp4, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp1, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                _r2 = _mm512_shuffle_i32x4(_tmp2, _tmp6, _MM_SHUFFLE(2, 0, 2, 0));
                _r3 = _mm512_shuffle_i32x4(_tmp3, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                _r4 = _mm512_shuffle_i32x4(_tmp0, _tmp4, _MM_SHUFFLE(3, 1, 3, 1));
                _r5 = _mm512_shuffle_i32x4(_tmp1, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                _r6 = _mm512_shuffle_i32x4(_tmp2, _tmp6, _MM_SHUFFLE(3, 1, 3, 1));
                _r7 = _mm512_shuffle_i32x4(_tmp3, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                _mm512_storeu_si512((__m512i*)(pp + 128), _r4);
                _mm512_storeu_si512((__m512i*)(pp + 160), _r5);
                _mm512_storeu_si512((__m512i*)(pp + 192), _r6);
                _mm512_storeu_si512((__m512i*)(pp + 224), _r7);
                p0 += max_jj * batch * 16;
                pp += 256;
            }
            p0 -= (b * max_jj + jj) * 16;
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(2, 0, 2, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 1, 3, 1));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r2, _r3, _MM_SHUFFLE(2, 0, 2, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r2, _r3, _MM_SHUFFLE(3, 1, 3, 1));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _tmp0 = _mm512_permutex_epi64(_r0, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp1 = _mm512_permutex_epi64(_r1, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp2 = _mm512_permutex_epi64(_r2, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp3 = _mm512_permutex_epi64(_r3, _MM_SHUFFLE(3, 1, 2, 0));
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp2, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp0, _tmp2, _MM_SHUFFLE(3, 1, 3, 1));
                _r2 = _mm512_shuffle_i32x4(_tmp1, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                _r3 = _mm512_shuffle_i32x4(_tmp1, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                p0 += max_jj * batch * 8;
                pp += 128;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                _mm512_storeu_si512((__m512i*)pp, _r0);
                p0 += max_jj * batch * 2;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                __m256i _r0 = _mm256_loadu_si256((const __m256i*)p0);
                _mm256_store_si256((__m256i*)pp, _r0);
                p0 += max_jj * batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; jj + 7 < max_jj; jj += 8)
        {
            const short* p0 = B;

            int kk = 0;
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _tmp0 = _mm512_unpacklo_epi64(_r0, _r2);
                _tmp1 = _mm512_unpackhi_epi64(_r0, _r2);
                _tmp2 = _mm512_unpacklo_epi64(_r1, _r3);
                _tmp3 = _mm512_unpackhi_epi64(_r1, _r3);
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                _r2 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                _r3 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                p0 += max_jj * batch * 16;
                pp += 128;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
#if __AVX__
                __m256 _r0 = _mm256_loadu_ps((const float*)p0);
                __m256 _r1 = _mm256_loadu_ps((const float*)(p0 + 16));
                __m256 _r2 = _mm256_loadu_ps((const float*)(p0 + 32));
                __m256 _r3 = _mm256_loadu_ps((const float*)(p0 + 48));
                __m256 _tmp0 = _mm256_permute2f128_ps(_r0, _r2, _MM_SHUFFLE(0, 2, 0, 0));
                __m256 _tmp1 = _mm256_permute2f128_ps(_r0, _r2, _MM_SHUFFLE(0, 3, 0, 1));
                __m256 _tmp2 = _mm256_permute2f128_ps(_r1, _r3, _MM_SHUFFLE(0, 2, 0, 0));
                __m256 _tmp3 = _mm256_permute2f128_ps(_r1, _r3, _MM_SHUFFLE(0, 3, 0, 1));
                _r0 = _mm256_unpacklo_ps(_tmp0, _tmp1);
                _r1 = _mm256_unpackhi_ps(_tmp0, _tmp1);
                _r2 = _mm256_unpacklo_ps(_tmp2, _tmp3);
                _r3 = _mm256_unpackhi_ps(_tmp2, _tmp3);
                _tmp0 = _mm256_castpd_ps(_mm256_unpacklo_pd(_mm256_castps_pd(_r0), _mm256_castps_pd(_r2)));
                _tmp1 = _mm256_castpd_ps(_mm256_unpackhi_pd(_mm256_castps_pd(_r0), _mm256_castps_pd(_r2)));
                _tmp2 = _mm256_castpd_ps(_mm256_unpacklo_pd(_mm256_castps_pd(_r1), _mm256_castps_pd(_r3)));
                _tmp3 = _mm256_castpd_ps(_mm256_unpackhi_pd(_mm256_castps_pd(_r1), _mm256_castps_pd(_r3)));
                _mm256_storeu_ps((float*)pp, _tmp0);
                _mm256_storeu_ps((float*)(pp + 16), _tmp1);
                _mm256_storeu_ps((float*)(pp + 32), _tmp2);
                _mm256_storeu_ps((float*)(pp + 48), _tmp3);
#else
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _r2 = _mm_load_si128((const __m128i*)(p0 + 8 * 2));
                __m128i _r3 = _mm_load_si128((const __m128i*)(p0 + 8 * 3));
                __m128i _r4 = _mm_load_si128((const __m128i*)(p0 + 8 * 4));
                __m128i _r5 = _mm_load_si128((const __m128i*)(p0 + 8 * 5));
                __m128i _r6 = _mm_load_si128((const __m128i*)(p0 + 8 * 6));
                __m128i _r7 = _mm_load_si128((const __m128i*)(p0 + 8 * 7));
                transpose4x8_epi32(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm_store_si128((__m128i*)pp, _r0);
                _mm_store_si128((__m128i*)(pp + 8), _r1);
                _mm_store_si128((__m128i*)(pp + 8 * 2), _r2);
                _mm_store_si128((__m128i*)(pp + 8 * 3), _r3);
                _mm_store_si128((__m128i*)(pp + 8 * 4), _r4);
                _mm_store_si128((__m128i*)(pp + 8 * 5), _r5);
                _mm_store_si128((__m128i*)(pp + 8 * 6), _r6);
                _mm_store_si128((__m128i*)(pp + 8 * 7), _r7);
#endif // __AVX__
                p0 += max_jj * batch * 8;
                pp += 64;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
#if __AVX__
                __m256 _r0 = _mm256_loadu_ps((const float*)p0);
                _mm256_storeu_ps((float*)pp, _r0);
#else
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)(p0 + 8));
                _mm_store_si128((__m128i*)pp, _r0);
                _mm_store_si128((__m128i*)(pp + 8), _r1);
#endif // __AVX__
                p0 += max_jj * batch * 2;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                _mm_store_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch;
                pp += 8;
            }
        }
#endif // defined(__x86_64__) || defined(_M_X64)
        for (; jj + 3 < max_jj; jj += 4)
        {
            const short* p0 = B;

            int kk = 0;
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r0 = _mm512_permutex_epi64(_r0, _MM_SHUFFLE(3, 1, 2, 0));
                _r1 = _mm512_permutex_epi64(_r1, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(1, 0, 1, 0));
                _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi64(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi64(_tmp0, _tmp1);
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                p0 += max_jj * batch * 16;
                pp += 64;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _r2 = _mm_load_si128((const __m128i*)(p0 + 8 * 2));
                __m128i _r3 = _mm_load_si128((const __m128i*)(p0 + 8 * 3));
                transpose4x4_epi32(_r0, _r1, _r2, _r3);
                _mm_storeu_si128((__m128i*)pp, _r0);
                _mm_storeu_si128((__m128i*)(pp + 8), _r1);
                _mm_storeu_si128((__m128i*)(pp + 8 * 2), _r2);
                _mm_storeu_si128((__m128i*)(pp + 8 * 3), _r3);
                p0 += max_jj * batch * 8;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                _mm_storeu_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch * 2;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                p0 += max_jj * batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; jj + 1 < max_jj; jj += 2)
        {
            const short* p0 = B;

            int kk = 0;
#if __SSE2__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m256i _r0 = _mm256_load_si256((const __m256i*)p0);
                __m256i _r1 = _mm256_load_si256((const __m256i*)(p0 + 16));
                transpose8x2_epi32(_r0, _r1);
                _mm256_storeu_si256((__m256i*)pp, _r0);
                _mm256_storeu_si256((__m256i*)(pp + 16), _r1);
                p0 += max_jj * batch * 16;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _tmp0 = _mm_unpacklo_epi32(_r0, _r1);
                __m128i _tmp1 = _mm_unpackhi_epi32(_r0, _r1);
                _mm_storeu_si128((__m128i*)pp, _tmp0);
                _mm_storeu_si128((__m128i*)(pp + 8), _tmp1);
                p0 += max_jj * batch * 8;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __SSE2__
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                p0 += max_jj * batch * 2;
                pp += 4;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                p0 += max_jj * batch;
                pp += 2;
            }
        }
        for (; jj < max_jj; jj++)
        {
            const short* p0 = B;

            int kk = 0;
#if __SSE2__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m256i _r0 = _mm256_load_si256((const __m256i*)p0);
                _mm256_storeu_si256((__m256i*)pp, _r0);
                p0 += max_jj * batch * 16;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                _mm_storeu_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch * 8;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __SSE2__
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                p0 += max_jj * batch * 2;
                pp += 2;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += max_jj * batch;
                pp += 1;
            }
        }
    }
}